

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O1

size_t __thiscall lan::safe_file::length(safe_file *this)

{
  int iVar1;
  FILE *pFVar2;
  size_t sVar3;
  char data_c;
  undefined1 local_19;
  
  if ((FILE *)this->file != (FILE *)0x0) {
    fclose((FILE *)this->file);
  }
  this->file = (FILE *)0x0;
  pFVar2 = fopen((this->filename)._M_dataplus._M_p,"r");
  this->file = (FILE *)pFVar2;
  if (pFVar2 == (FILE *)0x0) {
    sVar3 = 0;
  }
  else {
    local_19 = 0;
    iVar1 = feof((FILE *)this->file);
    sVar3 = 0;
    if (iVar1 == 0) {
      do {
        fread(&local_19,1,1,(FILE *)this->file);
        sVar3 = sVar3 + 1;
        iVar1 = feof((FILE *)this->file);
      } while (iVar1 == 0);
    }
  }
  return sVar3;
}

Assistant:

size_t safe_file::length(){
        close_fd();
        size_t length = 0;
        if((file = fopen(filename.data(), "r"))){
            char data_c = 0;
            while(!feof(file)){
                fread(&data_c, sizeof(char), 1, file); length++;
            }
        } return length;
    }